

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int usebuffer(int f,int n)

{
  int iVar1;
  char *bname;
  buffer *bp;
  char local_418 [8];
  char bufn [1024];
  
  if (curbp->b_altb == (buffer *)0x0) {
    bname = eread("Switch to buffer: ",local_418,0x400,10);
  }
  else {
    bname = eread("Switch to buffer (default %s): ",local_418,0x400,0x4a,
                  (curbp->b_altb->b_list).l_name);
  }
  if (bname == (char *)0x0) {
    iVar1 = 2;
  }
  else {
    if (((*bname != '\0') || (bp = curbp->b_altb, bp == (buffer *)0x0)) &&
       (bp = bfind(bname,1), bp == (buffer *)0x0)) {
      return 0;
    }
    curbp = bp;
    showbuffer(bp,curwp,9);
    eerase();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
usebuffer(int f, int n)
{
	char    bufn[NBUFN], *bufp;

	/* Get buffer to use from user */
	if (curbp->b_altb == NULL)
		bufp = eread("Switch to buffer: ", bufn, NBUFN, EFNEW | EFBUF);
	else
		bufp = eread("Switch to buffer (default %s): ", bufn, NBUFN,
		    EFNUL | EFNEW | EFBUF, curbp->b_altb->b_bname);

	if (bufp == NULL)
		return (ABORT);

	return (usebufname(bufp));
}